

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O0

void __thiscall ncnn::Mat::release(Mat *this)

{
  int iVar1;
  int *piVar2;
  undefined8 *in_RDI;
  
  if (in_RDI[1] != 0) {
    piVar2 = (int *)in_RDI[1];
    LOCK();
    iVar1 = *piVar2;
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (iVar1 == 1) {
      if (in_RDI[4] == 0) {
        ncnn::fastFree((void *)0x1227d6);
      }
      else {
        (**(code **)(*(long *)in_RDI[4] + 0x18))((long *)in_RDI[4],*in_RDI);
      }
    }
  }
  *in_RDI = 0;
  in_RDI[2] = 0;
  *(undefined4 *)(in_RDI + 3) = 0;
  *(undefined4 *)(in_RDI + 5) = 0;
  *(undefined4 *)((long)in_RDI + 0x2c) = 0;
  *(undefined4 *)(in_RDI + 6) = 0;
  *(undefined4 *)((long)in_RDI + 0x34) = 0;
  in_RDI[7] = 0;
  in_RDI[1] = 0;
  return;
}

Assistant:

inline void Mat::release()
{
    if (refcount && NCNN_XADD(refcount, -1) == 1)
    {
        if (allocator)
            allocator->fastFree(data);
        else
            fastFree(data);
    }

    data = 0;

    elemsize = 0;
    packing = 0;

    dims = 0;
    w = 0;
    h = 0;
    c = 0;

    cstep = 0;

    refcount = 0;
}